

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load(elfio *this,string *file_name,bool is_lazy)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  pointer pbVar3;
  type pbVar4;
  ulong uVar5;
  bool ret;
  byte local_21;
  string *psStack_20;
  bool is_lazy_local;
  string *file_name_local;
  elfio *this_local;
  
  local_21 = is_lazy;
  psStack_20 = file_name;
  file_name_local = (string *)this;
  std::make_unique<std::ifstream>();
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::operator=(&this->pstream,
              (unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               *)&stack0xffffffffffffffd0);
  std::
  unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                 *)&stack0xffffffffffffffd0);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->pstream);
  if (bVar1) {
    pbVar3 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator->(&this->pstream);
    _Var2 = std::__cxx11::string::c_str();
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)pbVar3,_Var2);
    pbVar4 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator*(&this->pstream);
    uVar5 = std::ios::operator!((ios *)(pbVar4 + *(long *)(*(long *)pbVar4 + -0x18)));
    if ((uVar5 & 1) == 0) {
      pbVar4 = std::
               unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
               ::operator*(&this->pstream);
      this_local._7_1_ = load(this,(istream *)pbVar4,(bool)(local_21 & 1));
      if ((local_21 & 1) == 0) {
        std::
        unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
        ::reset(&this->pstream,(pointer)0x0);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool load( const std::string& file_name, bool is_lazy = false )
    {
        pstream = std::make_unique<std::ifstream>();
        if ( !pstream ) {
            return false;
        }

        pstream->open( file_name.c_str(), std::ios::in | std::ios::binary );
        if ( !*pstream ) {
            return false;
        }

        bool ret = load( *pstream, is_lazy );

        if ( !is_lazy ) {
            pstream.reset();
        }

        return ret;
    }